

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O1

void CharConvWW(charconv *CC,wchar_t *Out,size_t OutLen,wchar_t *In)

{
  size_t sVar1;
  ulong uVar2;
  char *_Out;
  size_t _OutLen;
  size_t _InLen;
  char *_In;
  wchar_t *local_40;
  size_t local_38;
  size_t local_30;
  wchar_t *local_28;
  
  if (OutLen != 0) {
    local_28 = In;
    sVar1 = wcslen(In);
    local_38 = OutLen * 4;
    local_30 = sVar1 * 4 + 4;
    local_40 = Out;
    if (((local_30 == 0 || CC == (charconv *)0x0) ||
        (sVar1 = iconv(CC,(char **)&local_28,&local_30,(char **)&local_40,&local_38),
        sVar1 == 0xffffffffffffffff)) ||
       (sVar1 = iconv(CC,(char **)0x0,(size_t *)0x0,(char **)&local_40,&local_38),
       sVar1 == 0xffffffffffffffff)) {
      sVar1 = wcslen(In);
      uVar2 = OutLen - 1;
      if (sVar1 < OutLen - 1) {
        uVar2 = sVar1;
      }
      memcpy(Out,In,uVar2 * 4);
      Out[uVar2] = L'\0';
      if ((CC != (charconv *)0x0) && (local_30 != 0)) {
        iconv(CC,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *local_40 = L'\0';
    }
  }
  return;
}

Assistant:

void CharConvWW(charconv* CC, wchar_t* Out, size_t OutLen, const wchar_t* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = (wcslen(In)+1)*sizeof(wchar_t);
        char* _Out = (char*)Out;
        size_t _OutLen = OutLen*sizeof(wchar_t);

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
                iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            size_t n = MIN(wcslen(In),OutLen-1);
            memcpy(Out,In,n*sizeof(wchar_t));
            Out[n] = 0;
                if (CC && _InLen) iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
        }
        else
            *(wchar_t*)_Out=0;
   }
}